

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstatemanager_args.cpp
# Opt level: O1

Result<void> *
node::ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *args,Options *opts)

{
  optional<arith_uint256> *poVar1;
  undefined8 *puVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  bool bVar8;
  optional<bool> oVar9;
  int iVar10;
  int iVar11;
  int64_t iVar12;
  _Storage<long,_true> _Var13;
  int iVar14;
  uint *in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  optional<long> oVar15;
  string_view input;
  string_view input_00;
  undefined1 local_18c [4];
  undefined8 *local_188;
  long local_180;
  undefined8 local_178 [2];
  bilingual_str local_168;
  long *local_128;
  long local_120;
  long local_118 [2];
  undefined1 local_108 [32];
  long *local_e8 [2];
  long local_d8 [2];
  bilingual_str local_c8;
  optional<uint256> min_work;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_p = local_108 + 0x10;
  local_108._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-checkblockindex","");
  oVar15 = ArgsManager::GetIntArg(args,(string *)local_108);
  if ((pointer)local_108._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (((undefined1  [16])
       oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    _Var4._M_p = (pointer)((long)&value.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x10);
    value.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var4._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"-checkblockindex","");
    ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_108,args,(string *)&value);
    iVar11 = 1;
    if (local_108._8_8_ != 0) {
      iVar11 = oVar15.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._0_4_;
    }
    (opts->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_payload._M_value = iVar11;
    if ((opts->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == false) {
      (opts->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = true;
    }
    if ((local_e8[0]._0_1_ == (string)0x1) &&
       (local_e8[0] = (long *)((ulong)local_e8[0] & 0xffffffffffffff00),
       (pointer)local_108._0_8_ != _Var3._M_p)) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (value.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var4._M_p) {
      operator_delete((void *)value.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      value.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  local_108._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-checkpoints","");
  oVar9 = ArgsManager::GetBoolArg(args,(string *)local_108);
  if ((pointer)local_108._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (((ushort)oVar9.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    opts->checkpoints_enabled =
         oVar9.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_108._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-minimumchainwork","");
  ArgsManager::GetArg(&value,args,(string *)local_108);
  if ((pointer)local_108._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    input._M_str = (char *)value.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p;
    input._M_len = value.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length;
    detail::FromUserHex<uint256>(&min_work,input);
    bVar8 = min_work.super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged;
    if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == true) {
      UintToArith256((arith_uint256 *)local_108,(uint256 *)&min_work);
      poVar1 = &opts->minimum_chain_work;
      if ((opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>._M_payload.
          super__Optional_payload_base<arith_uint256>._M_engaged == false) {
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 0x10) =
             local_108._16_8_;
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 0x18) =
             local_108._24_8_;
        *(undefined8 *)
         &(poVar1->super__Optional_base<arith_uint256,_false,_false>)._M_payload.
          super__Optional_payload_base<arith_uint256>._M_payload = local_108._0_8_;
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 8) =
             local_108._8_8_;
        (opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>._M_payload.
        super__Optional_payload_base<arith_uint256>._M_engaged = true;
      }
      else if (poVar1 != (optional<arith_uint256> *)local_108) {
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 0x10) =
             local_108._16_8_;
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 0x18) =
             local_108._24_8_;
        *(undefined8 *)
         &(poVar1->super__Optional_base<arith_uint256,_false,_false>)._M_payload.
          super__Optional_payload_base<arith_uint256>._M_payload = local_108._0_8_;
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 8) =
             local_108._8_8_;
      }
    }
    else {
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,
                 "Invalid minimum work specified (%s), must be up to %d hex digits","");
      local_108._0_8_ = _Var3._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,local_128,local_120 + (long)local_128);
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,local_128,local_120 + (long)local_128);
      local_18c = (undefined1  [4])0x40;
      tinyformat::format<std::__cxx11::string,unsigned_int>
                (&local_c8,(tinyformat *)local_108,(bilingual_str *)&value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18c,
                 in_R8);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar2;
      paVar5 = &local_c8.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p == paVar5) {
        *puVar2 = CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                           local_c8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
             local_c8.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> =
             local_c8.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
             CONCAT71(local_c8.original.field_2._M_allocated_capacity._1_7_,
                      local_c8.original.field_2._M_local_buf[0]);
      }
      paVar6 = &local_c8.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
           local_c8.original._M_string_length;
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p == paVar6) {
        *puVar2 = CONCAT71(local_c8.translated.field_2._M_allocated_capacity._1_7_,
                           local_c8.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
             local_c8.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
             local_c8.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
             CONCAT71(local_c8.translated.field_2._M_allocated_capacity._1_7_,
                      local_c8.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
           local_c8.translated._M_string_length;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.original._M_string_length = 0;
      local_c8.original._M_dataplus._M_p = (pointer)paVar5;
      local_c8.translated._M_dataplus._M_p = (pointer)paVar6;
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0],local_d8[0] + 1);
      }
      if ((pointer)local_108._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
    }
    if (bVar8 != false) goto LAB_00225695;
    bVar8 = false;
  }
  else {
LAB_00225695:
    bVar8 = true;
  }
  if ((value.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     value.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&value.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)value.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    value.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if (!bVar8) goto LAB_00225b1e;
  local_108._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-assumevalid","");
  ArgsManager::GetArg(&value,args,(string *)local_108);
  if ((pointer)local_108._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    input_00._M_str =
         (char *)value.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    input_00._M_len =
         value.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    detail::FromUserHex<uint256>(&min_work,input_00);
    if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == true) {
      *(undefined8 *)
       &(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_payload =
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._0_8_;
      *(undefined8 *)
       ((long)&(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) =
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._8_8_;
      *(undefined8 *)
       ((long)&(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._16_8_;
      *(undefined8 *)
       ((long)&(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) =
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._24_8_;
      if ((opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged == false) {
        (opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged = true;
      }
    }
    else {
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"
                 ,"");
      local_108._0_8_ = _Var3._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,local_188,local_180 + (long)local_188);
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,local_188,local_180 + (long)local_188);
      local_18c = (undefined1  [4])0x40;
      tinyformat::format<std::__cxx11::string,unsigned_int>
                (&local_168,(tinyformat *)local_108,(bilingual_str *)&value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18c,
                 in_R8);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar2;
      paVar5 = &local_168.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.original._M_dataplus._M_p == paVar5) {
        *puVar2 = CONCAT71(local_168.original.field_2._M_allocated_capacity._1_7_,
                           local_168.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
             local_168.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> =
             local_168.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
             CONCAT71(local_168.original.field_2._M_allocated_capacity._1_7_,
                      local_168.original.field_2._M_local_buf[0]);
      }
      paVar6 = &local_168.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
           local_168.original._M_string_length;
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.translated._M_dataplus._M_p == paVar6) {
        *puVar2 = CONCAT71(local_168.translated.field_2._M_allocated_capacity._1_7_,
                           local_168.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
             local_168.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
             local_168.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
             CONCAT71(local_168.translated.field_2._M_allocated_capacity._1_7_,
                      local_168.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
           local_168.translated._M_string_length;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
      local_168.translated.field_2._M_local_buf[0] = '\0';
      local_168.translated._M_string_length = 0;
      local_168.original.field_2._M_local_buf[0] = '\0';
      local_168.original._M_string_length = 0;
      local_168.original._M_dataplus._M_p = (pointer)paVar5;
      local_168.translated._M_dataplus._M_p = (pointer)paVar6;
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0],local_d8[0] + 1);
      }
      if ((pointer)local_108._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      if (local_188 != local_178) {
        operator_delete(local_188,local_178[0] + 1);
      }
    }
    if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged != false) goto LAB_0022591d;
    bVar8 = false;
  }
  else {
LAB_0022591d:
    bVar8 = true;
  }
  if ((value.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     value.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&value.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)value.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    value.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  if (bVar8) {
    local_108._0_8_ = _Var3._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-maxtipage","");
    oVar15 = ArgsManager::GetIntArg(args,(string *)local_108);
    if ((pointer)local_108._0_8_ != _Var3._M_p) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (((undefined1  [16])
         oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (opts->max_tip_age).__r =
           oVar15.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    ReadDatabaseArgs(args,&opts->block_tree_db);
    ReadDatabaseArgs(args,&opts->coins_db);
    ReadCoinsViewArgs(args,&opts->coins_view);
    local_108._0_8_ = _Var3._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-par","");
    iVar12 = ArgsManager::GetIntArg(args,(string *)local_108,0);
    iVar11 = (int)iVar12;
    if ((pointer)local_108._0_8_ != _Var3._M_p) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (iVar11 < 1) {
      iVar10 = GetNumCores();
      iVar11 = iVar10 + iVar11;
    }
    iVar10 = 0x10;
    if (iVar11 < 0x10) {
      iVar10 = iVar11;
    }
    iVar14 = 0;
    if (0 < iVar11) {
      iVar14 = iVar10 + -1;
    }
    opts->worker_threads_num = iVar14;
    logging_function._M_str = "ApplyArgsManOptions";
    logging_function._M_len = 0x13;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstatemanager_args.cpp"
    ;
    source_file._M_len = 0x6f;
    LogPrintFormatInternal<int>
              (logging_function,source_file,0x40,ALL,Info,(ConstevalFormatString<1U>)0x7ecca3,
               &opts->worker_threads_num);
    local_108._0_8_ = _Var3._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-maxsigcachesize","");
    oVar15 = ArgsManager::GetIntArg(args,(string *)local_108);
    if ((pointer)local_108._0_8_ != _Var3._M_p) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (((undefined1  [16])
         oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var13._M_value = 0;
      if (0 < oVar15.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload) {
        _Var13._M_value =
             oVar15.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
      }
      opts->script_execution_cache_bytes = _Var13._M_value << 0x13;
      opts->signature_cache_bytes = _Var13._M_value << 0x13;
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
  }
LAB_00225b1e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, ChainstateManager::Options& opts)
{
    if (auto value{args.GetIntArg("-checkblockindex")}) {
        // Interpret bare -checkblockindex argument as 1 instead of 0.
        opts.check_block_index = args.GetArg("-checkblockindex")->empty() ? 1 : *value;
    }

    if (auto value{args.GetBoolArg("-checkpoints")}) opts.checkpoints_enabled = *value;

    if (auto value{args.GetArg("-minimumchainwork")}) {
        if (auto min_work{uint256::FromUserHex(*value)}) {
            opts.minimum_chain_work = UintToArith256(*min_work);
        } else {
            return util::Error{strprintf(Untranslated("Invalid minimum work specified (%s), must be up to %d hex digits"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetArg("-assumevalid")}) {
        if (auto block_hash{uint256::FromUserHex(*value)}) {
            opts.assumed_valid_block = *block_hash;
        } else {
            return util::Error{strprintf(Untranslated("Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetIntArg("-maxtipage")}) opts.max_tip_age = std::chrono::seconds{*value};

    ReadDatabaseArgs(args, opts.block_tree_db);
    ReadDatabaseArgs(args, opts.coins_db);
    ReadCoinsViewArgs(args, opts.coins_view);

    int script_threads = args.GetIntArg("-par", DEFAULT_SCRIPTCHECK_THREADS);
    if (script_threads <= 0) {
        // -par=0 means autodetect (number of cores - 1 script threads)
        // -par=-n means "leave n cores free" (number of cores - n - 1 script threads)
        script_threads += GetNumCores();
    }
    // Subtract 1 because the main thread counts towards the par threads.
    opts.worker_threads_num = std::clamp(script_threads - 1, 0, MAX_SCRIPTCHECK_THREADS);
    LogPrintf("Script verification uses %d additional threads\n", opts.worker_threads_num);

    if (auto max_size = args.GetIntArg("-maxsigcachesize")) {
        // 1. When supplied with a max_size of 0, both the signature cache and
        //    script execution cache create the minimum possible cache (2
        //    elements). Therefore, we can use 0 as a floor here.
        // 2. Multiply first, divide after to avoid integer truncation.
        size_t clamped_size_each = std::max<int64_t>(*max_size, 0) * (1 << 20) / 2;
        opts.script_execution_cache_bytes = clamped_size_each;
        opts.signature_cache_bytes = clamped_size_each;
    }

    return {};
}